

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quick_connection.cc
# Opt level: O0

int64_t __thiscall QuickConnection::TimeUntilNextProcess(QuickConnection *this)

{
  bool bVar1;
  uint16_t uVar2;
  pointer this_00;
  pointer pQVar3;
  QuicTime now;
  pointer this_01;
  QuicByteCount bytes_in_flight;
  pointer this_02;
  size_type sVar4;
  int64_t iVar5;
  int a;
  Delta local_18;
  Delta t;
  QuickConnection *this_local;
  undefined4 extraout_var;
  
  t.time_offset_ = (int64_t)this;
  this_00 = std::unique_ptr<quic::PacingSender,_std::default_delete<quic::PacingSender>_>::
            operator->(&this->_pacing_sender);
  pQVar3 = std::unique_ptr<quic::QuicClock,_std::default_delete<quic::QuicClock>_>::operator->
                     (&this->_clock);
  now.time_._0_4_ = (*pQVar3->_vptr_QuicClock[3])();
  now.time_._4_4_ = extraout_var;
  this_01 = std::
            unique_ptr<quic::QuicUnackedPacketMap,_std::default_delete<quic::QuicUnackedPacketMap>_>
            ::operator->(&this->_unacked_packet_map);
  bytes_in_flight = quic::QuicUnackedPacketMap::bytes_in_flight(this_01);
  local_18 = quic::PacingSender::TimeUntilSend(this_00,now,bytes_in_flight);
  this_02 = std::unique_ptr<RingBuffer<QuickPacket>,_std::default_delete<RingBuffer<QuickPacket>_>_>
            ::operator->(&this->_wait_send_packets);
  uVar2 = RingBuffer<QuickPacket>::GetPacketCount(this_02);
  if ((uVar2 == 0) &&
     (sVar4 = std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>::size
                        (&this->_wait_retransmission_packets), sVar4 == 0)) {
    local_18 = quic::QuicTime::Delta::FromMilliseconds(1);
  }
  bVar1 = quic::QuicTime::Delta::IsInfinite(&local_18);
  if (bVar1) {
    this->_wait_process_infinite = true;
    local_18 = quic::QuicTime::Delta::FromMilliseconds(1);
  }
  else {
    this->_wait_process_infinite = false;
  }
  iVar5 = quic::QuicTime::Delta::ToSeconds(&local_18);
  if (5 < iVar5) {
    quic::QuicTime::Delta::IsInfinite(&local_18);
  }
  iVar5 = quic::QuicTime::Delta::ToMilliseconds(&local_18);
  return iVar5;
}

Assistant:

int64_t QuickConnection::TimeUntilNextProcess()
{
	auto t = _pacing_sender->TimeUntilSend(_clock->Now(), _unacked_packet_map->bytes_in_flight());
	if (_wait_send_packets->GetPacketCount() == 0 && _wait_retransmission_packets.size() == 0)
		t = quic::QuicTime::Delta::FromMilliseconds(1);
	if (t.IsInfinite())
	{
		_wait_process_infinite = true;
		t = quic::QuicTime::Delta::FromMilliseconds(1);
	}
	else
		_wait_process_infinite = false;
	if (t.ToSeconds() > 5 && t.IsInfinite() == false)
		int a = 0;
	// test
	//return 0;
	return t.ToMilliseconds();
}